

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkPrintNode(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  ushort uVar1;
  int *piVar2;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t WVar4;
  FILE *__stream;
  int iVar5;
  uint uVar6;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar7;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  int k;
  int iVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  
  printf("%8d  :  ",(ulong)(uint)((int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555));
  iVar10 = (p->vLevels).nSize;
  if (iVar10 != 0) {
    uVar8 = (int)((long)pObj - (long)p->pObjs >> 3) * -0x55555555;
    if (((int)uVar8 < 0) || (iVar10 <= (int)uVar8)) goto LAB_0036cf39;
    printf("Lev = %2d  ",(ulong)(uint)(p->vLevels).pArray[uVar8 & 0x7fffffff]);
  }
  iVar5 = pObj->End - pObj->Beg;
  iVar10 = -iVar5;
  if (0 < iVar5) {
    iVar10 = iVar5;
  }
  pcVar13 = " ";
  pcVar14 = "s";
  pcVar9 = "s";
  if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x40) == (undefined1  [24])0x0)
  {
    pcVar9 = " ";
  }
  printf("%6d%s = ",(ulong)(iVar10 + 1),pcVar9);
  uVar1 = *(ushort *)pObj;
  uVar8 = uVar1 & 0x3f;
  if ((ulong)uVar8 == 6) {
LAB_0036cb0f:
    pcVar9 = "                                ";
  }
  else {
    if (uVar8 == 3) {
      pcVar9 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
      if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) {
        __assert_fail("pObj->Type == WLC_OBJ_FO",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
      }
      uVar8 = ((pObj->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar8 < 0) || ((p->vCos).nSize <= (int)uVar8)) {
LAB_0036cf39:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = (p->vCos).pArray[uVar8];
      if ((0 < iVar10) && (iVar10 < p->nObjsAlloc)) {
        pcVar13 = Wlc_ObjName(p,iVar10);
        printf("            FO                   :    %-12s = %-12s\n",pcVar9,pcVar13);
        return;
      }
      goto LAB_0036cf58;
    }
    if (uVar8 == 1) {
      pcVar9 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
      pcVar13 = "            PI                   :    %-12s\n";
LAB_0036ccda:
      printf(pcVar13,pcVar9);
      return;
    }
    if (pObj->nFanins == 0) {
      pcVar9 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
      pcVar13 = "Unknown object without fanins    :    %-12s\n";
      goto LAB_0036ccda;
    }
    if ((short)uVar8 == 6) goto LAB_0036cb0f;
    paVar7 = &pObj->field_10;
    if ((uVar1 & 0x2f) == 6 || 2 < pObj->nFanins) {
      paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar7->pFanins[0];
    }
    lVar12 = (long)paVar7->Fanins[0];
    if ((lVar12 < 1) || (p->nObjsAlloc <= paVar7->Fanins[0])) {
LAB_0036cf58:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    pWVar3 = p->pObjs;
    iVar5 = pWVar3[lVar12].End - pWVar3[lVar12].Beg;
    iVar10 = -iVar5;
    if (0 < iVar5) {
      iVar10 = iVar5;
    }
    paVar7 = &pObj->field_10;
    if ((uVar1 & 0x2f) == 6 || 2 < pObj->nFanins) {
      paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar7->pFanins[0];
    }
    iVar5 = paVar7->Fanins[0];
    if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036cf58;
    pcVar9 = "s";
    if ((undefined1  [24])((undefined1  [24])pWVar3[iVar5] & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      pcVar9 = " ";
    }
    printf("%6d%s  %5s  ",(ulong)(iVar10 + 1),pcVar9,Wlc_Names[uVar8]);
    uVar8 = pObj->nFanins;
    if ((int)uVar8 < 2) {
      printf("        ");
    }
    else {
      if ((uVar8 == 2) &&
         ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) !=
          (undefined1  [24])0x6)) {
        paVar7 = &pObj->field_10;
      }
      else {
        paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      lVar12 = (long)paVar7->Fanins[1];
      if ((lVar12 < 1) || (p->nObjsAlloc <= paVar7->Fanins[1])) goto LAB_0036cf58;
      pWVar3 = p->pObjs;
      iVar5 = pWVar3[lVar12].End - pWVar3[lVar12].Beg;
      iVar10 = -iVar5;
      if (0 < iVar5) {
        iVar10 = iVar5;
      }
      if ((uVar8 == 2) &&
         ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) !=
          (undefined1  [24])0x6)) {
        paVar7 = &pObj->field_10;
      }
      else {
        paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      iVar5 = paVar7->Fanins[1];
      if (((long)iVar5 < 1) || (p->nObjsAlloc <= iVar5)) goto LAB_0036cf58;
      pcVar9 = "s";
      if ((undefined1  [24])((undefined1  [24])pWVar3[iVar5] & (undefined1  [24])0x40) ==
          (undefined1  [24])0x0) {
        pcVar9 = " ";
      }
      printf("%6d%s ",(ulong)(iVar10 + 1),pcVar9);
    }
    if (2 < (int)pObj->nFanins) {
      lVar12 = (long)(pObj->field_10).pFanins[0][2];
      if ((lVar12 < 1) || (p->nObjsAlloc <= (pObj->field_10).pFanins[0][2])) goto LAB_0036cf58;
      iVar10 = (pObj->field_10).pFanins[0][2];
      if (((long)iVar10 < 1) || (p->nObjsAlloc <= iVar10)) goto LAB_0036cf58;
      pWVar3 = p->pObjs;
      iVar11 = pWVar3[lVar12].End - pWVar3[lVar12].Beg;
      iVar5 = -iVar11;
      if (0 < iVar11) {
        iVar5 = iVar11;
      }
      if ((undefined1  [24])((undefined1  [24])pWVar3[iVar10] & (undefined1  [24])0x40) !=
          (undefined1  [24])0x0) {
        pcVar13 = "s";
      }
      printf("%6d%s ",(ulong)(iVar5 + 1),pcVar13);
      goto LAB_0036cb1d;
    }
    pcVar9 = "        ";
  }
  printf(pcVar9);
LAB_0036cb1d:
  printf(" :    ");
  pcVar9 = Wlc_ObjName(p,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  printf("%-12s",pcVar9);
  WVar4 = *pObj;
  if ((undefined1  [24])((undefined1  [24])WVar4 & (undefined1  [24])0x3f) == (undefined1  [24])0x6)
  {
    iVar5 = pObj->End - pObj->Beg;
    iVar10 = -iVar5;
    if (0 < iVar5) {
      iVar10 = iVar5;
    }
    if ((undefined1  [24])((undefined1  [24])WVar4 & (undefined1  [24])0x40) ==
        (undefined1  [24])0x0) {
      pcVar14 = "";
    }
    uVar8 = 0;
    printf(" = %d\'%sh",(ulong)(iVar10 + 1),pcVar14);
    __stream = _stdout;
    if ((*(uint *)pObj >> 0xb & 1) == 0) {
      if (((ushort)*(uint *)pObj & 0x3f) != 6) {
        __assert_fail("p->Type == WLC_OBJ_CONST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x145,"int *Wlc_ObjConstValue(Wlc_Obj_t *)");
      }
      piVar2 = (pObj->field_10).pFanins[0];
      iVar5 = pObj->End - pObj->Beg;
      iVar10 = pObj->Beg - pObj->End;
      if (iVar10 <= iVar5) {
        iVar10 = iVar5;
      }
      iVar5 = (iVar10 + 4U >> 2) + 1;
      uVar8 = iVar10 + 4U & 0xfffffffc;
      do {
        uVar8 = uVar8 - 4;
        uVar6 = (uint)(*(ulong *)(piVar2 + (ulong)(iVar5 - 2U >> 4) * 2) >> ((byte)uVar8 & 0x3c)) &
                0xf;
        iVar10 = uVar6 + 0x30;
        if (9 < uVar6) {
          iVar10 = uVar6 + 0x57;
        }
        fputc(iVar10,__stream);
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
    else {
      do {
        putchar(0x78);
        uVar8 = uVar8 + 1;
        iVar5 = pObj->End - pObj->Beg;
        iVar10 = -iVar5;
        if (0 < iVar5) {
          iVar10 = iVar5;
        }
      } while (uVar8 < iVar10 + 4U >> 2);
    }
  }
  else {
    paVar7 = &pObj->field_10;
    if (((undefined1  [24])((undefined1  [24])WVar4 & (undefined1  [24])0x2f) ==
         (undefined1  [24])0x6) || (2 < pObj->nFanins)) {
      paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar7->pFanins[0];
    }
    pcVar9 = Wlc_ObjName(p,paVar7->Fanins[0]);
    printf(" =  %-12s  %5s  ",pcVar9,Wlc_Names[*(ushort *)pObj & 0x3f]);
    if ((int)pObj->nFanins < 2) {
      printf("             ");
    }
    else {
      if ((pObj->nFanins == 2) &&
         ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) !=
          (undefined1  [24])0x6)) {
        paVar7 = &pObj->field_10;
      }
      else {
        paVar7 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
      }
      pcVar9 = Wlc_ObjName(p,paVar7->Fanins[1]);
      printf("%-12s ",pcVar9);
    }
    if (2 < (int)pObj->nFanins) {
      pcVar9 = Wlc_ObjName(p,(pObj->field_10).pFanins[0][2]);
      printf("%-12s ",pcVar9);
    }
  }
  putchar(10);
  return;
}

Assistant:

void Wlc_NtkPrintNode( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    printf( "%8d  :  ", Wlc_ObjId(p, pObj) );
    if ( Vec_IntSize(&p->vLevels) )
        printf( "Lev = %2d  ", Vec_IntEntry(&p->vLevels, Wlc_ObjId(p,pObj)) );
    printf( "%6d%s = ", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s" : " " );
    if ( pObj->Type == WLC_OBJ_PI )
    {
        printf( "            PI                   :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type == WLC_OBJ_FO )
    {
        printf( "            FO                   :    %-12s = %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)), Wlc_ObjName(p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj))) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST && Wlc_ObjFaninNum(pObj) == 0 )
    {
        printf( "Unknown object without fanins    :    %-12s\n", Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        return;
    }
    if ( pObj->Type != WLC_OBJ_CONST )
    {
        printf( "%6d%s  %5s  ",  Wlc_ObjRange(Wlc_ObjFanin0(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin0(p, pObj)) ? "s" : " ", Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin1(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin1(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%6d%s ",       Wlc_ObjRange(Wlc_ObjFanin2(p, pObj)), Wlc_ObjIsSigned(Wlc_ObjFanin2(p, pObj)) ? "s" : " " );
        else
            printf( "        " );
    }
    else
        printf( "                                " );
    printf( " :    " );
    printf( "%-12s",   Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        printf( " = %d\'%sh", Wlc_ObjRange(pObj), Wlc_ObjIsSigned(pObj) ? "s":"" );
        if ( pObj->fXConst )
        {
            int k;
            for ( k = 0; k < (Wlc_ObjRange(pObj) + 3) / 4; k++ )
                printf( "x" );
        }
        else
            Abc_TtPrintHexArrayRev( stdout, (word *)Wlc_ObjConstValue(pObj), (Wlc_ObjRange(pObj) + 3) / 4 );
    }
    else
    {
        printf( " =  %-12s  %5s  ", Wlc_ObjName(p, Wlc_ObjFaninId0(pObj)), Wlc_Names[(int)pObj->Type] );
        if ( Wlc_ObjFaninNum(pObj) > 1 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId1(pObj)) );
        else
            printf( "             " );
        if ( Wlc_ObjFaninNum(pObj) > 2 )
            printf( "%-12s ",       Wlc_ObjName(p, Wlc_ObjFaninId2(pObj)) );
    }
    printf( "\n" );
}